

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O0

void __thiscall InjectPayloadCallfixup::restoreXml(InjectPayloadCallfixup *this,Element *el)

{
  Element *this_00;
  bool bVar1;
  string *psVar2;
  reference ppEVar3;
  LowlevelError *this_01;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  Element *local_78;
  Element *subel;
  Element **local_68;
  byte local_5d;
  bool pcodeSubtag;
  allocator local_49;
  string local_48 [32];
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_28;
  const_iterator iter;
  List *list;
  Element *el_local;
  InjectPayloadCallfixup *this_local;
  
  iter._M_current = (Element **)Element::getChildren(el);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  __normal_iterator(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"name",&local_49);
  psVar2 = Element::getAttributeValue(el,(string *)local_48);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InjectPayloadSleigh).super_InjectPayload.name,(string *)psVar2)
  ;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_5d = 0;
  local_68 = (Element **)std::vector<Element_*,_std::allocator<Element_*>_>::begin(iter._M_current);
  local_28._M_current = local_68;
  while( true ) {
    subel = (Element *)
            std::vector<Element_*,_std::allocator<Element_*>_>::end
                      ((vector<Element_*,_std::allocator<Element_*>_> *)iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                        *)&subel);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
              ::operator*(&local_28);
    local_78 = *ppEVar3;
    psVar2 = Element::getName_abi_cxx11_(local_78);
    bVar1 = std::operator==(psVar2,"pcode");
    if (bVar1) {
      InjectPayloadSleigh::restoreXml(&this->super_InjectPayloadSleigh,local_78);
      local_5d = 1;
    }
    else {
      psVar2 = Element::getName_abi_cxx11_(local_78);
      bVar1 = std::operator==(psVar2,"target");
      this_00 = local_78;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,"name",&local_99);
        psVar2 = Element::getAttributeValue(this_00,(string *)local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->targetSymbolNames,psVar2);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
      }
    }
    __gnu_cxx::
    __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator++(&local_28);
  }
  if ((local_5d & 1) != 0) {
    return;
  }
  this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+((char *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "<callfixup> is missing <pcode> subtag: ");
  LowlevelError::LowlevelError(this_01,local_c0);
  __cxa_throw(this_01,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void InjectPayloadCallfixup::restoreXml(const Element *el)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  name = el->getAttributeValue("name");
  bool pcodeSubtag = false;

  for(iter=list.begin();iter!=list.end();++iter) {
    const Element *subel = *iter;
    if (subel->getName() == "pcode") {
      InjectPayloadSleigh::restoreXml(subel);
      pcodeSubtag = true;
    }
    else if (subel->getName() == "target")
      targetSymbolNames.push_back(subel->getAttributeValue("name"));
  }
  if (!pcodeSubtag)
    throw LowlevelError("<callfixup> is missing <pcode> subtag: "+name);
}